

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_ipairs_aux(jit_State *J,RecordFFData *rd)

{
  TValue *pTVar1;
  TRef TVar2;
  TRef TVar3;
  TValue local_68;
  double local_60;
  uint local_38;
  TRef local_34;
  undefined4 local_30;
  undefined4 local_24;
  
  local_38 = *J->base;
  if ((local_38 & 0x1f000000) == 0xb000000) {
    pTVar1 = rd->argv;
    if (0xfffeffff < *(uint *)((long)pTVar1 + 0xc)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    local_60 = (double)((int)pTVar1[1].n + 1);
    local_68.field_2.field_0 = (pTVar1->field_2).field_0;
    local_68.field_2.it = 0xfffffff4;
    local_30 = 0;
    local_24 = 0;
    TVar2 = lj_opt_narrow_toint(J,J->base[1]);
    TVar3 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    local_34 = lj_opt_fold(J);
    *J->base = local_34;
    TVar2 = lj_record_idx(J,(RecordIndex *)&local_68.field_2);
    J->base[1] = TVar2;
    rd->nres = (ulong)((uint)((TVar2 & 0x1f000000) != 0) * 2);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_ipairs_aux(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  if (tref_istab(ix.tab)) {
    if (!tvisnumber(&rd->argv[1]))  /* No support for string coercion. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    setintV(&ix.keyv, numberVint(&rd->argv[1])+1);
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    ix.val = 0; ix.idxchain = 0;
    ix.key = lj_opt_narrow_toint(J, J->base[1]);
    J->base[0] = ix.key = emitir(IRTI(IR_ADD), ix.key, lj_ir_kint(J, 1));
    J->base[1] = lj_record_idx(J, &ix);
    rd->nres = tref_isnil(J->base[1]) ? 0 : 2;
  }  /* else: Interpreter will throw. */
}